

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMini.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkFromMiniAig(Mini_Aig_t *p)

{
  Abc_Aig_t *pMan;
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pNtk_00;
  char *pcVar3;
  Vec_Int_t *p_00;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *p1;
  Abc_Ntk_t *pTemp;
  int nNodes;
  int i;
  Vec_Int_t *vCopies;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk;
  Mini_Aig_t *p_local;
  
  iVar1 = Mini_AigNodeNum(p);
  pNtk_00 = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  pcVar3 = Abc_UtilStrsav("MiniAig");
  pNtk_00->pName = pcVar3;
  p_00 = Vec_IntAlloc(iVar1);
  pAVar4 = Abc_AigConst1(pNtk_00);
  iVar2 = Abc_ObjToLit(pAVar4);
  iVar2 = Abc_LitNot(iVar2);
  Vec_IntPush(p_00,iVar2);
  pTemp._4_4_ = 1;
  do {
    if (iVar1 <= pTemp._4_4_) {
      iVar2 = Vec_IntSize(p_00);
      if (iVar2 != iVar1) {
        __assert_fail("Vec_IntSize(vCopies) == nNodes",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMini.c"
                      ,0x56,"Abc_Ntk_t *Abc_NtkFromMiniAig(Mini_Aig_t *)");
      }
      Abc_AigCleanup((Abc_Aig_t *)pNtk_00->pManFunc);
      Vec_IntFree(p_00);
      Abc_NtkAddDummyPiNames(pNtk_00);
      Abc_NtkAddDummyPoNames(pNtk_00);
      iVar1 = Abc_NtkCheck(pNtk_00);
      if (iVar1 == 0) {
        fprintf(_stdout,"Abc_NtkFromMini(): Network check has failed.\n");
      }
      iVar1 = Mini_AigRegNum(p);
      pObj = (Abc_Obj_t *)pNtk_00;
      if (0 < iVar1) {
        iVar1 = Mini_AigRegNum(p);
        pObj = (Abc_Obj_t *)Abc_NtkRestrashWithLatches(pNtk_00,iVar1);
        Abc_NtkDelete(pNtk_00);
      }
      return (Abc_Ntk_t *)pObj;
    }
    iVar2 = Mini_AigNodeIsPi(p,pTemp._4_4_);
    if (iVar2 == 0) {
      iVar2 = Mini_AigNodeIsPo(p,pTemp._4_4_);
      if (iVar2 == 0) {
        iVar2 = Mini_AigNodeIsAnd(p,pTemp._4_4_);
        if (iVar2 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMini.c"
                        ,0x53,"Abc_Ntk_t *Abc_NtkFromMiniAig(Mini_Aig_t *)");
        }
        pMan = (Abc_Aig_t *)pNtk_00->pManFunc;
        pAVar4 = Abc_NodeFanin0Copy(pNtk_00,p_00,p,pTemp._4_4_);
        p1 = Abc_NodeFanin1Copy(pNtk_00,p_00,p,pTemp._4_4_);
        vCopies = (Vec_Int_t *)Abc_AigAnd(pMan,pAVar4,p1);
      }
      else {
        vCopies = (Vec_Int_t *)Abc_NtkCreatePo(pNtk_00);
        pAVar4 = Abc_NodeFanin0Copy(pNtk_00,p_00,p,pTemp._4_4_);
        Abc_ObjAddFanin((Abc_Obj_t *)vCopies,pAVar4);
      }
    }
    else {
      vCopies = (Vec_Int_t *)Abc_NtkCreatePi(pNtk_00);
    }
    iVar2 = Abc_ObjToLit((Abc_Obj_t *)vCopies);
    Vec_IntPush(p_00,iVar2);
    pTemp._4_4_ = pTemp._4_4_ + 1;
  } while( true );
}

Assistant:

Abc_Ntk_t * Abc_NtkFromMiniAig( Mini_Aig_t * p )
{
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pObj;
    Vec_Int_t * vCopies;
    int i, nNodes;
    // get the number of nodes
    nNodes = Mini_AigNodeNum(p);
    // create ABC network
    pNtk = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    pNtk->pName = Abc_UtilStrsav( "MiniAig" );
    // create mapping from MiniAIG objects into ABC objects
    vCopies = Vec_IntAlloc( nNodes );
    Vec_IntPush( vCopies, Abc_LitNot(Abc_ObjToLit(Abc_AigConst1(pNtk))) );
    // iterate through the objects
    for ( i = 1; i < nNodes; i++ )
    {
        if ( Mini_AigNodeIsPi( p, i ) )
            pObj = Abc_NtkCreatePi(pNtk);
        else if ( Mini_AigNodeIsPo( p, i ) )
            Abc_ObjAddFanin( (pObj = Abc_NtkCreatePo(pNtk)), Abc_NodeFanin0Copy(pNtk, vCopies, p, i) );
        else if ( Mini_AigNodeIsAnd( p, i ) )
            pObj = Abc_AigAnd((Abc_Aig_t *)pNtk->pManFunc, Abc_NodeFanin0Copy(pNtk, vCopies, p, i), Abc_NodeFanin1Copy(pNtk, vCopies, p, i));
        else assert( 0 );
        Vec_IntPush( vCopies, Abc_ObjToLit(pObj) );
    }
    assert( Vec_IntSize(vCopies) == nNodes );
    Abc_AigCleanup( (Abc_Aig_t *)pNtk->pManFunc );
    Vec_IntFree( vCopies );
    Abc_NtkAddDummyPiNames( pNtk );
    Abc_NtkAddDummyPoNames( pNtk );
    if ( !Abc_NtkCheck( pNtk ) )
        fprintf( stdout, "Abc_NtkFromMini(): Network check has failed.\n" );
    // add latches
    if ( Mini_AigRegNum(p) > 0 )
    {
        extern Abc_Ntk_t * Abc_NtkRestrashWithLatches( Abc_Ntk_t * pNtk, int nLatches );
        Abc_Ntk_t * pTemp;
        pNtk = Abc_NtkRestrashWithLatches( pTemp = pNtk, Mini_AigRegNum(p) );
        Abc_NtkDelete( pTemp );
    }
    return pNtk;
}